

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5PorterStep1B(char *aBuf,int *pnBuf)

{
  int iVar1;
  int iVar2;
  uint local_1c;
  int nBuf;
  int ret;
  int *pnBuf_local;
  char *aBuf_local;
  
  local_1c = 0;
  iVar1 = *pnBuf;
  if (aBuf[iVar1 + -2] == 'e') {
    if ((iVar1 < 4) || (iVar2 = memcmp("eed",aBuf + (iVar1 + -3),3), iVar2 != 0)) {
      if ((2 < iVar1) && (iVar2 = memcmp("ed",aBuf + (iVar1 + -2),2), iVar2 == 0)) {
        iVar2 = fts5Porter_Vowel(aBuf,iVar1 + -2);
        if (iVar2 != 0) {
          *pnBuf = iVar1 + -2;
        }
        local_1c = (uint)(iVar2 != 0);
      }
    }
    else {
      iVar2 = fts5Porter_MGt0(aBuf,iVar1 + -3);
      if (iVar2 != 0) {
        (aBuf + (iVar1 + -3))[0] = 'e';
        (aBuf + (iVar1 + -3))[1] = 'e';
        *pnBuf = iVar1 + -1;
      }
    }
  }
  else if (((aBuf[iVar1 + -2] == 'n') && (3 < iVar1)) &&
          (iVar2 = memcmp("ing",aBuf + (iVar1 + -3),3), iVar2 == 0)) {
    iVar2 = fts5Porter_Vowel(aBuf,iVar1 + -3);
    if (iVar2 != 0) {
      *pnBuf = iVar1 + -3;
    }
    local_1c = (uint)(iVar2 != 0);
  }
  return local_1c;
}

Assistant:

static int fts5PorterStep1B(char *aBuf, int *pnBuf){
  int ret = 0;
  int nBuf = *pnBuf;
  switch( aBuf[nBuf-2] ){
    
    case 'e': 
      if( nBuf>3 && 0==memcmp("eed", &aBuf[nBuf-3], 3) ){
        if( fts5Porter_MGt0(aBuf, nBuf-3) ){
          memcpy(&aBuf[nBuf-3], "ee", 2);
          *pnBuf = nBuf - 3 + 2;
        }
      }else if( nBuf>2 && 0==memcmp("ed", &aBuf[nBuf-2], 2) ){
        if( fts5Porter_Vowel(aBuf, nBuf-2) ){
          *pnBuf = nBuf - 2;
          ret = 1;
        }
      }
      break;
  
    case 'n': 
      if( nBuf>3 && 0==memcmp("ing", &aBuf[nBuf-3], 3) ){
        if( fts5Porter_Vowel(aBuf, nBuf-3) ){
          *pnBuf = nBuf - 3;
          ret = 1;
        }
      }
      break;
  
  }
  return ret;
}